

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgl.c
# Opt level: O1

int RunGLTest(int argc,char **argv,int logo,int logocursor,int slowly,int bpp,float gamma,
             int noframe,int fsaa,int sync,int accel)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  int logo_00;
  ulong uVar10;
  int fsaa_00;
  undefined8 *puVar11;
  char **ppcVar12;
  undefined8 *puVar13;
  char *pcVar14;
  uint uVar15;
  char *__s1;
  undefined8 uVar16;
  int iVar17;
  undefined8 uVar18;
  double dVar19;
  int value;
  float color [8] [3];
  SDL_Event event;
  int iStack_190;
  int iStack_18c;
  int iStack_188;
  float fStack_184;
  uint local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  undefined8 local_108;
  undefined1 local_fc [12];
  undefined1 local_f0 [12];
  undefined1 local_e4 [12];
  undefined1 local_d8 [12];
  undefined1 local_cc [12];
  undefined1 local_c0 [12];
  undefined1 local_b4 [12];
  undefined8 local_a8;
  undefined1 local_9c [12];
  undefined1 local_90 [12];
  undefined1 local_84 [12];
  undefined1 local_78 [12];
  undefined1 local_6c [12];
  undefined1 local_60 [12];
  undefined1 local_54 [12];
  SDL_Event local_48;
  
  uVar10 = (ulong)(uint)bpp;
  puVar11 = &DAT_00104490;
  puVar13 = &local_a8;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar13 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar13 = puVar13 + 1;
  }
  ppcVar12 = (char **)&DAT_001044f0;
  puVar11 = &local_108;
  for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar11 = *ppcVar12;
    ppcVar12 = ppcVar12 + 1;
    puVar11 = puVar11 + 1;
  }
  pcVar14 = (char *)0x20;
  local_118 = logo;
  local_110 = logocursor;
  local_10c = slowly;
  iVar2 = SDL_Init();
  if (iVar2 < 0) {
    RunGLTest_cold_3();
  }
  else {
    if (bpp == 0) {
      lVar8 = SDL_GetVideoInfo();
      uVar10 = (ulong)((uint)(8 < *(byte *)(*(long *)(lVar8 + 8) + 8)) * 8 + 8);
    }
    uVar15 = (uint)(local_118 != 0 & USE_DEPRECATED_OPENGLBLIT) * 8 + 2;
    pcVar14 = argv[1];
    if (pcVar14 != (char *)0x0) {
      ppcVar12 = argv + 2;
      do {
        iVar2 = strcmp(pcVar14,"-fullscreen");
        if (iVar2 == 0) {
          uVar15 = uVar15 | 0x80000000;
        }
        pcVar14 = *ppcVar12;
        ppcVar12 = ppcVar12 + 1;
      } while (pcVar14 != (char *)0x0);
    }
    uVar1 = uVar15 | 0x20;
    if (noframe == 0) {
      uVar1 = uVar15;
    }
    if ((int)uVar10 - 0xfU < 2) {
      uVar18 = 5;
      uVar16 = 5;
    }
    else if ((int)uVar10 == 8) {
      uVar16 = 2;
      uVar18 = 3;
    }
    else {
      uVar18 = 8;
      uVar16 = 8;
    }
    SDL_GL_SetAttribute(0,uVar18);
    SDL_GL_SetAttribute(1,uVar18);
    SDL_GL_SetAttribute(2,uVar16);
    SDL_GL_SetAttribute(6,0x10);
    SDL_GL_SetAttribute(5,1);
    if (fsaa != 0) {
      SDL_GL_SetAttribute(0xd,1);
      SDL_GL_SetAttribute(0xe,fsaa);
    }
    if (accel != 0) {
      SDL_GL_SetAttribute(0xf,1);
    }
    SDL_GL_SetAttribute(0x10,sync != 0);
    pcVar14 = (char *)0x280;
    ppcVar12 = (char **)0x1e0;
    lVar8 = SDL_SetVideoMode(0x280,0x1e0,uVar10,uVar1);
    if (lVar8 != 0) {
      lVar8 = SDL_GetVideoSurface();
      printf("Screen BPP: %d\n",(ulong)*(byte *)(*(long *)(lVar8 + 8) + 8));
      putchar(10);
      uVar7 = glGetString(0x1f00);
      printf("Vendor     : %s\n",uVar7);
      uVar7 = glGetString(0x1f01);
      printf("Renderer   : %s\n",uVar7);
      uVar7 = glGetString(0x1f02);
      printf("Version    : %s\n",uVar7);
      uVar7 = glGetString(0x1f03);
      printf("Extensions : %s\n",uVar7);
      putchar(10);
      SDL_GL_GetAttribute(0,&local_11c);
      printf("SDL_GL_RED_SIZE: requested %d, got %d\n",uVar18,(ulong)local_11c);
      SDL_GL_GetAttribute(1,&local_11c);
      printf("SDL_GL_GREEN_SIZE: requested %d, got %d\n",uVar18,(ulong)local_11c);
      SDL_GL_GetAttribute(2,&local_11c);
      printf("SDL_GL_BLUE_SIZE: requested %d, got %d\n",uVar16,(ulong)local_11c);
      SDL_GL_GetAttribute(6,&local_11c);
      printf("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",uVar10,(ulong)local_11c);
      SDL_GL_GetAttribute(5,&local_11c);
      printf("SDL_GL_DOUBLEBUFFER: requested 1, got %d\n",(ulong)local_11c);
      if (fsaa != 0) {
        SDL_GL_GetAttribute(0xd,&local_11c);
        printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",(ulong)local_11c);
        SDL_GL_GetAttribute(0xe,&local_11c);
        printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",(ulong)(uint)fsaa,
               (ulong)local_11c);
      }
      if (accel != 0) {
        SDL_GL_GetAttribute(0xf,&local_11c);
        printf("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",(ulong)local_11c);
      }
      if (sync != 0) {
        SDL_GL_GetAttribute(0x10,&local_11c);
        printf("SDL_GL_SWAP_CONTROL: requested 1, got %d\n",(ulong)local_11c);
      }
      SDL_WM_SetCaption("SDL GL test","testgl");
      if ((gamma != 0.0) || (NAN(gamma))) {
        SDL_SetGamma(gamma,gamma,gamma);
      }
      glViewport(0,0,0x280,0x1e0);
      glMatrixMode(0x1701);
      glLoadIdentity();
      glOrtho(0xc000000000000000,0x4000000000000000,0xc000000000000000,0x4000000000000000,
              0xc034000000000000,0x4034000000000000);
      glMatrixMode(0x1700);
      glLoadIdentity();
      glEnable(0xb71);
      glDepthFunc(0x201);
      glShadeModel(0x1d01);
      local_114 = SDL_GetTicks();
      iVar9 = 0;
      iVar2 = 0;
      do {
        glClearColor(0,0,0,0x3f800000);
        glClear(0x4100);
        glBegin(7);
        glColor3fv(&local_a8);
        glVertex3fv(&local_108);
        glColor3fv(local_9c);
        glVertex3fv(local_fc);
        glColor3fv(local_90);
        glVertex3fv(local_f0);
        glColor3fv(local_84);
        glVertex3fv(local_e4);
        glColor3fv(local_84);
        glVertex3fv(local_e4);
        glColor3fv(local_78);
        glVertex3fv(local_d8);
        glColor3fv(local_54);
        glVertex3fv(local_b4);
        glColor3fv(local_90);
        glVertex3fv(local_f0);
        glColor3fv(&local_a8);
        glVertex3fv(&local_108);
        glColor3fv(local_6c);
        glVertex3fv(local_cc);
        glColor3fv(local_60);
        glVertex3fv(local_c0);
        glColor3fv(local_9c);
        glVertex3fv(local_fc);
        glColor3fv(local_6c);
        glVertex3fv(local_cc);
        glColor3fv(local_78);
        glVertex3fv(local_d8);
        glColor3fv(local_54);
        glVertex3fv(local_b4);
        glColor3fv(local_60);
        glVertex3fv(local_c0);
        glColor3fv(local_6c);
        glVertex3fv(local_cc);
        glColor3fv(&local_a8);
        glVertex3fv(&local_108);
        glColor3fv(local_84);
        glVertex3fv(local_e4);
        glColor3fv(local_78);
        glVertex3fv(local_d8);
        glColor3fv(local_60);
        glVertex3fv(local_c0);
        glColor3fv(local_9c);
        glVertex3fv(local_fc);
        glColor3fv(local_90);
        glVertex3fv(local_f0);
        glColor3fv(local_54);
        glVertex3fv(local_b4);
        glEnd();
        glMatrixMode(0x1700);
        glRotatef(0x40a00000,0x3f800000,0x3f800000,0x3f800000);
        if (local_118 != 0) {
          if (USE_DEPRECATED_OPENGLBLIT == 1) {
            DrawLogoBlit();
          }
          else {
            DrawLogoTexture();
          }
        }
        if (local_110 != 0) {
          DrawLogoCursor();
        }
        SDL_GL_SwapBuffers();
        uVar15 = glGetError();
        if (uVar15 != 0) {
          fprintf(_stderr,"testgl: OpenGL error: %d\n",(ulong)uVar15);
        }
        pcVar14 = (char *)SDL_GetError();
        if (*pcVar14 != '\0') {
          RunGLTest_cold_1();
        }
        if (local_10c != 0) {
          SDL_Delay(0x14);
        }
        while (iVar3 = SDL_PollEvent(&local_48), iVar3 != 0) {
          iVar2 = HandleEvent(&local_48);
        }
        iVar9 = iVar9 + 1;
      } while (iVar2 == 0);
      iVar2 = SDL_GetTicks();
      if (iVar2 - local_114 != 0) {
        printf("%2.2f FPS\n",(double)((float)iVar9 / (float)(uint)(iVar2 - local_114)) * 1000.0);
      }
      if (global_image != (SDL_Surface *)0x0) {
        SDL_FreeSurface();
        global_image = (SDL_Surface *)0x0;
      }
      if (global_texture != 0) {
        glDeleteTextures(1,&global_texture);
        global_texture = 0;
      }
      if (cursor_texture != 0) {
        glDeleteTextures(1,&cursor_texture);
        cursor_texture = 0;
      }
      SDL_Quit();
      return 0;
    }
  }
  RunGLTest_cold_2();
  __s1 = ppcVar12[1];
  if (__s1 == (char *)0x0) {
    fStack_184 = 0.0;
    iVar17 = 1;
    logo_00 = 0;
    iStack_190 = 0;
    iStack_188 = 0;
    iStack_18c = 0;
    iVar3 = 0;
    fsaa_00 = 0;
    iVar9 = 0;
    iVar2 = 0;
  }
  else {
    fStack_184 = 0.0;
    iVar2 = 0;
    iVar9 = 0;
    fsaa_00 = 0;
    iVar3 = 0;
    iStack_18c = 0;
    iStack_188 = 0;
    iVar17 = 1;
    iStack_190 = 0;
    logo_00 = 0;
    iVar6 = 1;
    do {
      iVar4 = strcmp(__s1,"-twice");
      iVar17 = iVar17 + (uint)(iVar4 == 0);
      iVar4 = strcmp(__s1,"-logo");
      if (iVar4 == 0) {
        USE_DEPRECATED_OPENGLBLIT = 0;
        logo_00 = 1;
      }
      iVar4 = strcmp(__s1,"-logoblit");
      if (iVar4 == 0) {
        USE_DEPRECATED_OPENGLBLIT = 1;
        logo_00 = 1;
      }
      iVar4 = strcmp(__s1,"-logocursor");
      if (iVar4 == 0) {
        iStack_190 = 1;
      }
      iVar4 = strcmp(__s1,"-slow");
      if (iVar4 == 0) {
        iStack_18c = 1;
      }
      iVar4 = strcmp(__s1,"-bpp");
      if (iVar4 == 0) {
        lVar8 = (long)iVar6;
        iVar6 = iVar6 + 1;
        iStack_188 = atoi(ppcVar12[lVar8 + 1]);
      }
      iVar5 = strcmp(ppcVar12[iVar6],"-gamma");
      iVar4 = iVar6;
      if (iVar5 == 0) {
        iVar4 = iVar6 + 1;
        dVar19 = atof(ppcVar12[(long)iVar6 + 1]);
        fStack_184 = (float)dVar19;
      }
      pcVar14 = ppcVar12[iVar4];
      iVar6 = strncmp(pcVar14,"-h",2);
      if (iVar6 == 0) {
        printf("Usage: %s [-twice] [-logo] [-logocursor] [-slow] [-bpp n] [-gamma n] [-noframe] [-fsaa] [-accel] [-sync] [-fullscreen]\n"
               ,*ppcVar12);
        exit(0);
      }
      iVar6 = strcmp(pcVar14,"-sync");
      iVar2 = iVar2 + (uint)(iVar6 == 0);
      iVar6 = strcmp(pcVar14,"-accel");
      iVar9 = iVar9 + (uint)(iVar6 == 0);
      iVar6 = strcmp(pcVar14,"-fsaa");
      fsaa_00 = fsaa_00 + (uint)(iVar6 == 0);
      iVar6 = strcmp(pcVar14,"-noframe");
      if (iVar6 == 0) {
        iVar3 = 1;
      }
      iVar6 = iVar4 + 1;
      __s1 = ppcVar12[(long)iVar4 + 1];
    } while (__s1 != (char *)0x0);
  }
  iVar17 = iVar17 + (uint)(iVar17 == 0);
  do {
    RunGLTest((int)pcVar14,ppcVar12,logo_00,iStack_190,iStack_18c,iStack_188,fStack_184,iVar3,
              fsaa_00,iVar2,iVar9);
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  return 0;
}

Assistant:

int RunGLTest( int argc, char* argv[],
               int logo, int logocursor, int slowly, int bpp, float gamma, int noframe, int fsaa, int sync, int accel )
{
	int i;
	int rgb_size[3];
	int w = 640;
	int h = 480;
	int done = 0;
	int frames;
	Uint32 start_time, this_time;
        float color[8][3]= {{ 1.0,  1.0,  0.0}, 
			    { 1.0,  0.0,  0.0},
			    { 0.0,  0.0,  0.0},
			    { 0.0,  1.0,  0.0},
			    { 0.0,  1.0,  1.0},
			    { 1.0,  1.0,  1.0},
			    { 1.0,  0.0,  1.0},
			    { 0.0,  0.0,  1.0}};
	float cube[8][3]= {{ 0.5,  0.5, -0.5}, 
			   { 0.5, -0.5, -0.5},
			   {-0.5, -0.5, -0.5},
			   {-0.5,  0.5, -0.5},
			   {-0.5,  0.5,  0.5},
			   { 0.5,  0.5,  0.5},
			   { 0.5, -0.5,  0.5},
			   {-0.5, -0.5,  0.5}};
	Uint32 video_flags;
	int value;

	if( SDL_Init( SDL_INIT_VIDEO ) < 0 ) {
		fprintf(stderr,"Couldn't initialize SDL: %s\n",SDL_GetError());
		exit( 1 );
	}

	/* See if we should detect the display depth */
	if ( bpp == 0 ) {
		if ( SDL_GetVideoInfo()->vfmt->BitsPerPixel <= 8 ) {
			bpp = 8;
		} else {
			bpp = 16;  /* More doesn't seem to work */
		}
	}

	/* Set the flags we want to use for setting the video mode */
	if ( logo && USE_DEPRECATED_OPENGLBLIT ) {
		video_flags = SDL_OPENGLBLIT;
	} else {
		video_flags = SDL_OPENGL;
	}
	for ( i=1; argv[i]; ++i ) {
		if ( strcmp(argv[i], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
		}
	}

        if (noframe) {
           video_flags |= SDL_NOFRAME;
        }

	/* Initialize the display */
	switch (bpp) {
	    case 8:
		rgb_size[0] = 3;
		rgb_size[1] = 3;
		rgb_size[2] = 2;
		break;
	    case 15:
	    case 16:
		rgb_size[0] = 5;
		rgb_size[1] = 5;
		rgb_size[2] = 5;
		break;
            default:
		rgb_size[0] = 8;
		rgb_size[1] = 8;
		rgb_size[2] = 8;
		break;
	}
	SDL_GL_SetAttribute( SDL_GL_RED_SIZE, rgb_size[0] );
	SDL_GL_SetAttribute( SDL_GL_GREEN_SIZE, rgb_size[1] );
	SDL_GL_SetAttribute( SDL_GL_BLUE_SIZE, rgb_size[2] );
	SDL_GL_SetAttribute( SDL_GL_DEPTH_SIZE, 16 );
	SDL_GL_SetAttribute( SDL_GL_DOUBLEBUFFER, 1 );
	if ( fsaa ) {
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLEBUFFERS, 1 );
		SDL_GL_SetAttribute( SDL_GL_MULTISAMPLESAMPLES, fsaa );
	}
	if ( accel ) {
		SDL_GL_SetAttribute( SDL_GL_ACCELERATED_VISUAL, 1 );
	}
	if ( sync ) {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 1 );
	} else {
		SDL_GL_SetAttribute( SDL_GL_SWAP_CONTROL, 0 );
	}
	if ( SDL_SetVideoMode( w, h, bpp, video_flags ) == NULL ) {
		fprintf(stderr, "Couldn't set GL mode: %s\n", SDL_GetError());
		SDL_Quit();
		exit(1);
	}

	printf("Screen BPP: %d\n", SDL_GetVideoSurface()->format->BitsPerPixel);
	printf("\n");
	printf( "Vendor     : %s\n", glGetString( GL_VENDOR ) );
	printf( "Renderer   : %s\n", glGetString( GL_RENDERER ) );
	printf( "Version    : %s\n", glGetString( GL_VERSION ) );
	printf( "Extensions : %s\n", glGetString( GL_EXTENSIONS ) );
	printf("\n");

	SDL_GL_GetAttribute( SDL_GL_RED_SIZE, &value );
	printf( "SDL_GL_RED_SIZE: requested %d, got %d\n", rgb_size[0],value);
	SDL_GL_GetAttribute( SDL_GL_GREEN_SIZE, &value );
	printf( "SDL_GL_GREEN_SIZE: requested %d, got %d\n", rgb_size[1],value);
	SDL_GL_GetAttribute( SDL_GL_BLUE_SIZE, &value );
	printf( "SDL_GL_BLUE_SIZE: requested %d, got %d\n", rgb_size[2],value);
	SDL_GL_GetAttribute( SDL_GL_DEPTH_SIZE, &value );
	printf( "SDL_GL_DEPTH_SIZE: requested %d, got %d\n", bpp, value );
	SDL_GL_GetAttribute( SDL_GL_DOUBLEBUFFER, &value );
	printf( "SDL_GL_DOUBLEBUFFER: requested 1, got %d\n", value );
	if ( fsaa ) {
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLEBUFFERS, &value );
		printf("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value );
		SDL_GL_GetAttribute( SDL_GL_MULTISAMPLESAMPLES, &value );
		printf("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa, value );
	}
	if ( accel ) {
		SDL_GL_GetAttribute( SDL_GL_ACCELERATED_VISUAL, &value );
		printf( "SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value );
	}
	if ( sync ) {
		SDL_GL_GetAttribute( SDL_GL_SWAP_CONTROL, &value );
		printf( "SDL_GL_SWAP_CONTROL: requested 1, got %d\n", value );
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption( "SDL GL test", "testgl" );

	/* Set the gamma for the window */
	if ( gamma != 0.0 ) {
		SDL_SetGamma(gamma, gamma, gamma);
	}

	glViewport( 0, 0, w, h );
	glMatrixMode( GL_PROJECTION );
	glLoadIdentity( );

	glOrtho( -2.0, 2.0, -2.0, 2.0, -20.0, 20.0 );

	glMatrixMode( GL_MODELVIEW );
	glLoadIdentity( );

	glEnable(GL_DEPTH_TEST);

	glDepthFunc(GL_LESS);

	glShadeModel(GL_SMOOTH);

	/* Loop until done. */
	start_time = SDL_GetTicks();
	frames = 0;
	while( !done ) {
		GLenum gl_error;
		char* sdl_error;
		SDL_Event event;

		/* Do our drawing, too. */
		glClearColor( 0.0, 0.0, 0.0, 1.0 );
		glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

		glBegin( GL_QUADS );

#ifdef SHADED_CUBE
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			
			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
			glColor3fv(color[6]);
			glVertex3fv(cube[6]);

			glColor3fv(color[5]);
			glVertex3fv(cube[5]);
			glColor3fv(color[0]);
			glVertex3fv(cube[0]);
			glColor3fv(color[3]);
			glVertex3fv(cube[3]);
			glColor3fv(color[4]);
			glVertex3fv(cube[4]);

			glColor3fv(color[6]);
			glVertex3fv(cube[6]);
			glColor3fv(color[1]);
			glVertex3fv(cube[1]);
			glColor3fv(color[2]);
			glVertex3fv(cube[2]);
			glColor3fv(color[7]);
			glVertex3fv(cube[7]);
#else /* flat cube */
			glColor3f(1.0, 0.0, 0.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[3]);
			
			glColor3f(0.0, 1.0, 0.0);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[2]);
			
			glColor3f(0.0, 0.0, 1.0);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			
			glColor3f(0.0, 1.0, 1.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[4]);
			glVertex3fv(cube[7]);
			glVertex3fv(cube[6]);

			glColor3f(1.0, 1.0, 0.0);
			glVertex3fv(cube[5]);
			glVertex3fv(cube[0]);
			glVertex3fv(cube[3]);
			glVertex3fv(cube[4]);

			glColor3f(1.0, 0.0, 1.0);
			glVertex3fv(cube[6]);
			glVertex3fv(cube[1]);
			glVertex3fv(cube[2]);
			glVertex3fv(cube[7]);
#endif /* SHADED_CUBE */

		glEnd( );
		
		glMatrixMode(GL_MODELVIEW);
		glRotatef(5.0, 1.0, 1.0, 1.0);

		/* Draw 2D logo onto the 3D display */
		if ( logo ) {
			if ( USE_DEPRECATED_OPENGLBLIT ) {
				DrawLogoBlit();
			} else {
				DrawLogoTexture();
			}
		}
		if ( logocursor ) {
			DrawLogoCursor();
		}

		SDL_GL_SwapBuffers( );

		/* Check for error conditions. */
		gl_error = glGetError( );

		if( gl_error != GL_NO_ERROR ) {
			fprintf( stderr, "testgl: OpenGL error: %d\n", gl_error );
		}

		sdl_error = SDL_GetError( );

		if( sdl_error[0] != '\0' ) {
			fprintf(stderr, "testgl: SDL error '%s'\n", sdl_error);
			SDL_ClearError();
		}

		/* Allow the user to see what's happening */
		if ( slowly ) {
			SDL_Delay( 20 );
		}

		/* Check if there's a pending event. */
		while( SDL_PollEvent( &event ) ) {
			done = HandleEvent(&event);
		}
		++frames;
	}

	/* Print out the frames per second */
	this_time = SDL_GetTicks();
	if ( this_time != start_time ) {
		printf("%2.2f FPS\n",
			((float)frames/(this_time-start_time))*1000.0);
	}

	if ( global_image ) {
	   	SDL_FreeSurface(global_image);
		global_image = NULL;
	}
	if ( global_texture ) {
		glDeleteTextures( 1, &global_texture );
		global_texture = 0;
	}
	if ( cursor_texture ) {
		glDeleteTextures( 1, &cursor_texture );
		cursor_texture = 0;
	}

	/* Destroy our GL context, etc. */
	SDL_Quit( );
	return(0);
}